

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers_p.h
# Opt level: O2

void QtPromisePrivate::connectDestroyedToReject<void,Object>
               (QPromiseConnections *connections,QPromiseReject<void> *reject,Object *sender)

{
  Connection local_40;
  __shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2> local_38;
  Data *local_28;
  
  std::__shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             (__shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2> *)
             connections);
  local_28 = (reject->m_resolver).m_d.d;
  if (local_28 != (Data *)0x0) {
    LOCK();
    (local_28->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_28->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  QObject::
  connect<void(QObject::*)(QObject*),QtPromisePrivate::connectDestroyedToReject<void,Object>(QtPromise::QPromiseConnections_const&,QtPromise::QPromiseReject<void>const&,Object_const*)::_lambda()_1_>
            ((Object *)&local_40,(offset_in_QObject_to_subr)sender,
             (anon_class_24_2_90de82aa_for_function *)QObject::destroyed);
  QtPromise::QPromiseConnections::operator<<(connections,&local_40);
  QMetaObject::Connection::~Connection(&local_40);
  connectDestroyedToReject<void,Object>(QtPromise::QPromiseConnections_const&,QtPromise::QPromiseReject<void>const&,Object_const*)
  ::{lambda()#1}::~QPromiseReject((_lambda___1_ *)&local_38);
  return;
}

Assistant:

void connectDestroyedToReject(const QtPromise::QPromiseConnections& connections,
                              const QtPromise::QPromiseReject<T>& reject,
                              const Sender* sender)
{
    connections << QObject::connect(sender, &QObject::destroyed, [=]() {
        connections.disconnect();
        reject(QtPromise::QPromiseContextException{});
    });
}